

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cVertexAttribBindingTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::BasicInputCase6::Run(BasicInputCase6 *this)

{
  long lVar1;
  Vector<float,_4> local_21c;
  Vector<float,_4> local_20c;
  Vector<float,_4> local_1fc;
  Vector<float,_4> local_1ec;
  Vector<float,_4> local_1dc;
  Vector<float,_4> local_1cc;
  Vector<float,_4> local_1bc;
  Vector<float,_4> local_1ac;
  Vector<float,_4> local_19c;
  Vector<float,_4> local_18c;
  Vector<float,_4> local_17c;
  Vector<float,_4> local_16c;
  Vector<float,_4> local_15c;
  Vector<float,_4> local_14c;
  Vector<float,_4> local_13c;
  Vector<float,_4> local_12c;
  Vector<float,_4> local_11c;
  Vector<float,_4> local_10c;
  Vector<float,_4> local_fc;
  Vector<float,_4> local_ec;
  uint local_dc;
  undefined4 local_d8;
  GLuint i_1;
  GLint d_19;
  GLuint d_18;
  GLhalf d_17 [4];
  GLfloat d_16 [4];
  GLint d_15 [4];
  GLshort d_14 [4];
  GLbyte d_13 [4];
  GLuint d_12 [4];
  GLushort d_11 [4];
  GLubyte d_10 [4];
  GLint d_9;
  GLuint d_8;
  GLhalf d_7 [4];
  GLfloat d_6 [4];
  GLint d_5 [4];
  GLshort d_4 [4];
  GLbyte d_3 [4];
  GLuint d_2 [4];
  GLushort d_1 [4];
  GLubyte d [4];
  int kStride;
  GLuint i;
  BasicInputCase6 *this_local;
  
  d[0] = '\0';
  d[1] = '\0';
  d[2] = '\0';
  d[3] = '\0';
  for (; (uint)d < 0x10; d = (GLubyte  [4])((int)d + 1)) {
    glu::CallLogWrapper::glVertexAttrib4f
              (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
                super_GLWrapper.super_CallLogWrapper,(GLuint)d,0.0,0.0,0.0,0.0);
  }
  d_1[2] = 0x70;
  d_1[3] = 0;
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,this->m_vbo);
  glu::CallLogWrapper::glBufferData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0xe0,(void *)0x0,0x88e4);
  d_1[0] = 0x201;
  d_1[1] = 0x403;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0,4,d_1);
  stack0xffffffffffffffdc = 0x8000700060005;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,4,8,d_2 + 3);
  stack0xffffffffffffffc8 = 0xa00000009;
  d_2[0] = 0xb;
  d_2[1] = 0xc;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0xc,0x10,d_4 + 2);
  d_4[0] = 0x2ff;
  d_4[1] = 0x4fd;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x1c,4,d_4);
  stack0xffffffffffffffbc = 0x8fff90006fffb;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x20,8,d_5 + 3);
  d_6[2] = -NAN;
  d_6[3] = 1.4013e-44;
  d_5[0] = -0xb;
  d_5[1] = 0xc;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x28,0x10,d_6 + 2);
  d_7[0] = 0;
  d_7[1] = 0xc150;
  d_7[2] = 0;
  d_7[3] = 0x4160;
  d_6[0] = -15.0;
  d_6[1] = 16.0;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x38,0x10,d_7);
  d_9._0_2_ = VertexAttribBindingBase::FloatToHalf((VertexAttribBindingBase *)this,-18.0);
  d_9._2_2_ = VertexAttribBindingBase::FloatToHalf((VertexAttribBindingBase *)this,19.0);
  d_8._0_2_ = VertexAttribBindingBase::FloatToHalf((VertexAttribBindingBase *)this,-20.0);
  d_8._2_2_ = VertexAttribBindingBase::FloatToHalf((VertexAttribBindingBase *)this,21.0);
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x48,8,&d_9);
  d_10[0] = '\0';
  d_10[1] = ',';
  d_10[2] = 0xc0;
  d_10[3] = 0x80;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x68,4,d_10);
  d_11[2] = 0xd400;
  d_11[3] = 0x40cf;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x6c,4,d_11 + 2);
  d_11[0] = 0x1716;
  d_11[1] = 0x1918;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x70,4,d_11);
  stack0xffffffffffffff7c = 0x1d001c001b001a;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x74,8,d_12 + 3);
  stack0xffffffffffffff68 = 0x1f0000001e;
  d_12[0] = 0x20;
  d_12[1] = 0x21;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x7c,0x10,d_14 + 2);
  d_14[0] = 0x23de;
  d_14[1] = 0x25dc;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x8c,4,d_14);
  stack0xffffffffffffff5c = 0x29ffd80027ffda;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x90,8,d_15 + 3);
  d_16[2] = -NAN;
  d_16[3] = 6.02558e-44;
  d_15[0] = -0x2c;
  d_15[1] = 0x2d;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x98,0x10,d_16 + 2);
  d_17[0] = 0;
  d_17[1] = 0xc238;
  d_17[2] = 0;
  d_17[3] = 0x423c;
  d_16[0] = -48.0;
  d_16[1] = 49.0;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0xa8,0x10,d_17);
  d_19._0_2_ = VertexAttribBindingBase::FloatToHalf((VertexAttribBindingBase *)this,-50.0);
  d_19._2_2_ = VertexAttribBindingBase::FloatToHalf((VertexAttribBindingBase *)this,51.0);
  d_18._0_2_ = VertexAttribBindingBase::FloatToHalf((VertexAttribBindingBase *)this,-52.0);
  d_18._2_2_ = VertexAttribBindingBase::FloatToHalf((VertexAttribBindingBase *)this,53.0);
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0xb8,8,&d_19);
  i_1 = 0x40c02c00;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0xd8,4,&i_1);
  local_d8 = 0xe0cff47b;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0xdc,4,&local_d8);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0);
  glu::CallLogWrapper::glBindVertexArray
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,this->m_vao);
  glu::CallLogWrapper::glVertexAttribFormat
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0,4,0x1401,'\0',0);
  glu::CallLogWrapper::glVertexAttribFormat
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,1,4,0x1403,'\0',4);
  glu::CallLogWrapper::glVertexAttribFormat
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,2,4,0x1405,'\0',0xc);
  glu::CallLogWrapper::glVertexAttribFormat
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,3,4,0x1400,'\0',0x1c);
  glu::CallLogWrapper::glVertexAttribFormat
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,4,4,0x1402,'\0',0x20);
  glu::CallLogWrapper::glVertexAttribFormat
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,5,4,0x1404,'\0',0x28);
  glu::CallLogWrapper::glVertexAttribFormat
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,6,4,0x1406,'\0',0x38);
  glu::CallLogWrapper::glVertexAttribFormat
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,7,4,0x140b,'\0',0x48);
  glu::CallLogWrapper::glVertexAttribFormat
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,8,4,0x8368,'\0',0x68);
  glu::CallLogWrapper::glVertexAttribFormat
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,9,4,0x8d9f,'\0',0x6c);
  for (local_dc = 0; local_dc < 10; local_dc = local_dc + 1) {
    glu::CallLogWrapper::glVertexAttribBinding
              (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
                super_GLWrapper.super_CallLogWrapper,local_dc,0);
    glu::CallLogWrapper::glEnableVertexAttribArray
              (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
                super_GLWrapper.super_CallLogWrapper,local_dc);
  }
  glu::CallLogWrapper::glBindVertexBuffer
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0,this->m_vbo,0,0x70);
  tcu::Vector<float,_4>::Vector(&local_ec,1.0,2.0,3.0,4.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0].m_data = local_ec.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0].m_data + 2) = local_ec.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_fc,5.0,6.0,7.0,8.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[1].m_data = local_fc.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[1].m_data + 2) = local_fc.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_10c,9.0,10.0,11.0,12.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[2].m_data = local_10c.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[2].m_data + 2) = local_10c.m_data._8_8_
  ;
  tcu::Vector<float,_4>::Vector(&local_11c,-1.0,2.0,-3.0,4.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[3].m_data = local_11c.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[3].m_data + 2) = local_11c.m_data._8_8_
  ;
  tcu::Vector<float,_4>::Vector(&local_12c,-5.0,6.0,-7.0,8.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[4].m_data = local_12c.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[4].m_data + 2) = local_12c.m_data._8_8_
  ;
  tcu::Vector<float,_4>::Vector(&local_13c,-9.0,10.0,-11.0,12.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[5].m_data = local_13c.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[5].m_data + 2) = local_13c.m_data._8_8_
  ;
  tcu::Vector<float,_4>::Vector(&local_14c,-13.0,14.0,-15.0,16.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[6].m_data = local_14c.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[6].m_data + 2) = local_14c.m_data._8_8_
  ;
  tcu::Vector<float,_4>::Vector(&local_15c,-18.0,19.0,-20.0,21.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[7].m_data = local_15c.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[7].m_data + 2) = local_15c.m_data._8_8_
  ;
  tcu::Vector<float,_4>::Vector(&local_16c,0.0,11.0,12.0,2.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[8].m_data = local_16c.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[8].m_data + 2) = local_16c.m_data._8_8_
  ;
  tcu::Vector<float,_4>::Vector(&local_17c,0.0,-11.0,12.0,1.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[9].m_data = local_17c.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[9].m_data + 2) = local_17c.m_data._8_8_
  ;
  tcu::Vector<float,_4>::Vector(&local_18c,22.0,23.0,24.0,25.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0xf].m_data = local_18c.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0xf].m_data + 2) =
       local_18c.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_19c,26.0,27.0,28.0,29.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0x10].m_data = local_19c.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0x10].m_data + 2) =
       local_19c.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_1ac,30.0,31.0,32.0,33.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0x11].m_data = local_1ac.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0x11].m_data + 2) =
       local_1ac.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_1bc,-34.0,35.0,-36.0,37.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0x12].m_data = local_1bc.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0x12].m_data + 2) =
       local_1bc.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_1cc,-38.0,39.0,-40.0,41.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0x13].m_data = local_1cc.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0x13].m_data + 2) =
       local_1cc.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_1dc,-42.0,43.0,-44.0,45.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0x14].m_data = local_1dc.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0x14].m_data + 2) =
       local_1dc.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_1ec,-46.0,47.0,-48.0,49.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0x15].m_data = local_1ec.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0x15].m_data + 2) =
       local_1ec.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_1fc,-50.0,51.0,-52.0,53.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0x16].m_data = local_1fc.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0x16].m_data + 2) =
       local_1fc.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_20c,0.0,11.0,12.0,1.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0x17].m_data = local_20c.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0x17].m_data + 2) =
       local_20c.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_21c,123.0,-3.0,-500.0,-1.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0x18].m_data = local_21c.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0x18].m_data + 2) =
       local_21c.m_data._8_8_;
  lVar1 = BasicInputBase::Run(&this->super_BasicInputBase);
  return lVar1;
}

Assistant:

virtual long Run()
	{
		for (GLuint i = 0; i < 16; ++i)
		{
			glVertexAttrib4f(i, 0.0f, 0.0f, 0.0f, 0.0f);
		}
		const int kStride = 112;
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo);
		glBufferData(GL_ARRAY_BUFFER, kStride * 2, NULL, GL_STATIC_DRAW);
		/* */
		{
			GLubyte d[] = { 1, 2, 3, 4 };
			glBufferSubData(GL_ARRAY_BUFFER, 0, sizeof(d), d);
		}
		/* */
		{
			GLushort d[] = { 5, 6, 7, 8 };
			glBufferSubData(GL_ARRAY_BUFFER, 4, sizeof(d), d);
		}
		/* */
		{
			GLuint d[] = { 9, 10, 11, 12 };
			glBufferSubData(GL_ARRAY_BUFFER, 12, sizeof(d), d);
		}
		/* */
		{
			GLbyte d[] = { -1, 2, -3, 4 };
			glBufferSubData(GL_ARRAY_BUFFER, 28, sizeof(d), d);
		}
		/* */
		{
			GLshort d[] = { -5, 6, -7, 8 };
			glBufferSubData(GL_ARRAY_BUFFER, 32, sizeof(d), d);
		}
		/* */
		{
			GLint d[] = { -9, 10, -11, 12 };
			glBufferSubData(GL_ARRAY_BUFFER, 40, sizeof(d), d);
		}
		/* */
		{
			GLfloat d[] = { -13.0f, 14.0f, -15.0f, 16.0f };
			glBufferSubData(GL_ARRAY_BUFFER, 56, sizeof(d), d);
		}
		/* */
		{
			GLhalf d[] = { FloatToHalf(-18.0), FloatToHalf(19.0), FloatToHalf(-20.0), FloatToHalf(21.0) };
			glBufferSubData(GL_ARRAY_BUFFER, 72, sizeof(d), d);
		}
		/* */
		{
			GLuint d = 0 | (11 << 10) | (12 << 20) | (2u << 30);
			glBufferSubData(GL_ARRAY_BUFFER, 104, sizeof(d), &d);
		}
		/* */
		{
			GLint d = 0 | ((0xFFFFFFF5 << 10) & (0x3ff << 10)) | (12 << 20) | (1 << 30);
			glBufferSubData(GL_ARRAY_BUFFER, 108, sizeof(d), &d);
		}

		/* */
		{
			GLubyte d[] = { 22, 23, 24, 25 };
			glBufferSubData(GL_ARRAY_BUFFER, 0 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLushort d[] = { 26, 27, 28, 29 };
			glBufferSubData(GL_ARRAY_BUFFER, 4 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLuint d[] = { 30, 31, 32, 33 };
			glBufferSubData(GL_ARRAY_BUFFER, 12 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLbyte d[] = { -34, 35, -36, 37 };
			glBufferSubData(GL_ARRAY_BUFFER, 28 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLshort d[] = { -38, 39, -40, 41 };
			glBufferSubData(GL_ARRAY_BUFFER, 32 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLint d[] = { -42, 43, -44, 45 };
			glBufferSubData(GL_ARRAY_BUFFER, 40 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLfloat d[] = { -46.0f, 47.0f, -48.0f, 49.0f };
			glBufferSubData(GL_ARRAY_BUFFER, 56 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLhalf d[] = { FloatToHalf(-50.0), FloatToHalf(51.0), FloatToHalf(-52.0), FloatToHalf(53.0) };
			glBufferSubData(GL_ARRAY_BUFFER, 72 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLuint d = 0 | (11 << 10) | (12 << 20) | (1 << 30);
			glBufferSubData(GL_ARRAY_BUFFER, 104 + kStride, sizeof(d), &d);
		}
		/* */
		{
			GLint d = 123 | ((0xFFFFFFFD << 10) & (0x3ff << 10)) | ((0xFFFFFE0C << 20) & (0x3ff << 20)) |
					  ((0xFFFFFFFF << 30) & (0x3 << 30));
			glBufferSubData(GL_ARRAY_BUFFER, 108 + kStride, sizeof(d), &d);
		}
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		glBindVertexArray(m_vao);
		glVertexAttribFormat(0, 4, GL_UNSIGNED_BYTE, GL_FALSE, 0);
		glVertexAttribFormat(1, 4, GL_UNSIGNED_SHORT, GL_FALSE, 4);
		glVertexAttribFormat(2, 4, GL_UNSIGNED_INT, GL_FALSE, 12);
		glVertexAttribFormat(3, 4, GL_BYTE, GL_FALSE, 28);
		glVertexAttribFormat(4, 4, GL_SHORT, GL_FALSE, 32);
		glVertexAttribFormat(5, 4, GL_INT, GL_FALSE, 40);
		glVertexAttribFormat(6, 4, GL_FLOAT, GL_FALSE, 56);
		glVertexAttribFormat(7, 4, GL_HALF_FLOAT, GL_FALSE, 72);
		glVertexAttribFormat(8, 4, GL_UNSIGNED_INT_2_10_10_10_REV, GL_FALSE, 104);
		glVertexAttribFormat(9, 4, GL_INT_2_10_10_10_REV, GL_FALSE, 108);
		for (GLuint i = 0; i < 10; ++i)
		{
			glVertexAttribBinding(i, 0);
			glEnableVertexAttribArray(i);
		}
		glBindVertexBuffer(0, m_vbo, 0, kStride);

		expected_data[0]	  = Vec4(1.0f, 2.0f, 3.0f, 4.0f);
		expected_data[1]	  = Vec4(5.0f, 6.0f, 7.0f, 8.0f);
		expected_data[2]	  = Vec4(9.0f, 10.0f, 11.0f, 12.0f);
		expected_data[3]	  = Vec4(-1.0f, 2.0f, -3.0f, 4.0f);
		expected_data[4]	  = Vec4(-5.0f, 6.0f, -7.0f, 8.0f);
		expected_data[5]	  = Vec4(-9.0f, 10.0f, -11.0f, 12.0f);
		expected_data[6]	  = Vec4(-13.0f, 14.0f, -15.0f, 16.0f);
		expected_data[7]	  = Vec4(-18.0f, 19.0f, -20.0f, 21.0f);
		expected_data[8]	  = Vec4(0.0f, 11.0f, 12.0f, 2.0f);
		expected_data[9]	  = Vec4(0.0f, -11.0f, 12.0f, 1.0f);
		expected_data[0 + 15] = Vec4(22.0f, 23.0f, 24.0f, 25.0f);
		expected_data[1 + 15] = Vec4(26.0f, 27.0f, 28.0f, 29.0f);
		expected_data[2 + 15] = Vec4(30.0f, 31.0f, 32.0f, 33.0f);
		expected_data[3 + 15] = Vec4(-34.0f, 35.0f, -36.0f, 37.0f);
		expected_data[4 + 15] = Vec4(-38.0f, 39.0f, -40.0f, 41.0f);
		expected_data[5 + 15] = Vec4(-42.0f, 43.0f, -44.0f, 45.0f);
		expected_data[6 + 15] = Vec4(-46.0f, 47.0f, -48.0f, 49.0f);
		expected_data[7 + 15] = Vec4(-50.0f, 51.0f, -52.0f, 53.0f);
		expected_data[8 + 15] = Vec4(0.0f, 11.0f, 12.0f, 1.0f);
		expected_data[9 + 15] = Vec4(123.0f, -3.0f, -500.0f, -1.0f);
		return BasicInputBase::Run();
	}